

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::MaybeAppend(State *state,char *str)

{
  size_t length;
  long lVar1;
  undefined1 in_AL;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  size_t sVar2;
  
  if (-1 < *(int *)&(state->parse_state).field_0xc) {
    return (bool)in_AL;
  }
  if (*str != '\0') {
    sVar2 = 0;
    do {
      length = sVar2 + 1;
      lVar1 = sVar2 + 1;
      sVar2 = length;
    } while (str[lVar1] != '\0');
    MaybeAppendWithLength(state,str,length);
    return (bool)extraout_AL;
  }
  MaybeAppendWithLength(state,str,0);
  return (bool)extraout_AL_00;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    size_t length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}